

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmTst<(moira::Instr)127,(moira::Mode)4,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  byte bVar4;
  char *pcVar5;
  char cVar6;
  
  bVar4 = str->upper;
  pcVar5 = "btst";
  if ((bool)bVar4 != false) {
    pcVar5 = "BTST";
  }
  pcVar5 = pcVar5 + 1;
  cVar6 = *pcVar5;
  if (cVar6 != '\0') {
    do {
      pcVar5 = pcVar5 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar6;
      cVar6 = *pcVar5;
    } while (cVar6 != '\0');
    bVar4 = str->upper;
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar4 & 1) << 5 | 0x57;
  iVar1 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar1) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  str->ptr = pcVar5 + 1;
  *pcVar5 = '-';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = '(';
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ')';
  return;
}

Assistant:

StrWriter&
StrWriter::operator<<(Ins<I> i)
{
    *this << (upper ? instrUpper[I] : instrLower[I]);
    return *this;
}